

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O3

void __thiscall Hpipe::Source::Source(Source *this,char *file,char *text,bool need_cp)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  undefined3 in_register_00000009;
  
  this->prev = (Source *)0x0;
  if (CONCAT31(in_register_00000009,need_cp) == 0) {
    this->provenance = file;
    this->rese = (char *)0x0;
  }
  else {
    sVar1 = strlen(file);
    sVar2 = strlen(text);
    __dest = (char *)malloc(sVar2 + sVar1 + 2);
    this->rese = __dest;
    memcpy(__dest,file,sVar1 + 1);
    this->provenance = __dest;
    memcpy(__dest + sVar1 + 1,text,sVar2 + 1);
    text = __dest + sVar1 + 1;
  }
  this->data = text;
  return;
}

Assistant:

Source::Source( const char *file, const char *text, bool need_cp ) : prev( 0 ) {
    if ( need_cp ) {
        ssize_t size_prov = strlen( file ) + 1;
        ssize_t size_data = strlen( text ) + 1;
        rese = (char *)malloc( size_prov + size_data );

        memcpy( rese, file, size_prov );
        provenance = rese;

        memcpy( rese + size_prov, text, size_data );
        data = rese + size_prov;
    } else {
        provenance = file;
        data = text;
        rese = 0;
    }
}